

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O3

Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t> __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcCallContext::consumeRedirectedResponse
          (RpcCallContext *this)

{
  RpcServerResponse *pRVar1;
  RpcResponse *in_RDX;
  RpcResponse *extraout_RDX;
  RpcCallContext *in_RSI;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t> OVar2;
  Fault f;
  DebugExpression<bool_&> _kjCondition;
  Fault local_50;
  Builder local_48;
  Maybe<capnp::MessageSize> local_28;
  
  local_48.builder.segment = (SegmentBuilder *)&in_RSI->redirectResults;
  if (in_RSI->redirectResults == false) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool&>&>
              (&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
               ,0xc30,FAILED,"redirectResults","_kjCondition,",(DebugExpression<bool_&> *)&local_48)
    ;
    kj::_::Debug::Fault::fatal(&local_50);
  }
  pRVar1 = (in_RSI->response).ptr.ptr;
  if (pRVar1 == (RpcServerResponse *)0x0) {
    local_28.ptr.isSet = true;
    local_28.ptr.field_1.value.wordCount = 0;
    local_28.ptr.field_1.value.capCount = 0;
    getResults(&local_48,in_RSI,&local_28);
    pRVar1 = (in_RSI->response).ptr.ptr;
    in_RDX = extraout_RDX;
    if (pRVar1 == (RpcServerResponse *)0x0) {
      local_50.exception = (Exception *)0x0;
      local_48.builder.segment = (SegmentBuilder *)0x0;
      local_48.builder.capTable = (CapTableBuilder *)0x0;
      kj::_::Debug::Fault::init
                (&local_50,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                );
      kj::_::Debug::Fault::fatal(&local_50);
    }
  }
  *(int *)&pRVar1[2]._vptr_RpcServerResponse = *(int *)&pRVar1[2]._vptr_RpcServerResponse + 1;
  (this->super_CallContextHook)._vptr_CallContextHook = (_func_int **)(pRVar1 + 1);
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)(pRVar1 + -1);
  OVar2.ptr = in_RDX;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

kj::Own<RpcResponse> consumeRedirectedResponse() {
      KJ_ASSERT(redirectResults);

      if (response == kj::none) getResults(MessageSize{0, 0});  // force initialization of response

      // Note that the context needs to keep its own reference to the response so that it doesn't
      // get GC'd until the PipelineHook drops its reference to the context.
      return kj::downcast<LocallyRedirectedRpcResponse>(*KJ_ASSERT_NONNULL(response)).addRef();
    }